

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.h
# Opt level: O3

void __thiscall
ScriptCompression::Ser<HashWriter>(ScriptCompression *this,HashWriter *s,CScript *script)

{
  CScript *data;
  undefined8 data_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  direct_or_indirect local_48;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = 0;
  local_48.direct[0x20] = '\0';
  local_24 = 0;
  bVar1 = CompressScript(script,(CompressedScript *)&local_48.indirect_contents);
  if (bVar1) {
    uVar2 = local_24 - 0x22;
    data_00 = local_48.indirect_contents.indirect;
    if (local_24 < 0x22) {
      uVar2 = local_24;
      data_00 = &local_48;
    }
    CSHA256::Write(&s->ctx,(uchar *)data_00,(ulong)uVar2);
  }
  else {
    uVar2 = (script->super_CScriptBase)._size;
    uVar3 = uVar2 - 0x1d;
    if (uVar2 < 0x1d) {
      uVar3 = uVar2;
    }
    WriteVarInt<HashWriter,(VarIntMode)0,unsigned_int>(s,uVar3 + 6);
    uVar2 = (script->super_CScriptBase)._size;
    uVar3 = uVar2 - 0x1d;
    data = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar2 < 0x1d) {
      uVar3 = uVar2;
      data = script;
    }
    CSHA256::Write(&s->ctx,(uchar *)data,(ulong)uVar3);
  }
  if (0x21 < local_24) {
    free(local_48.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const CScript& script) {
        CompressedScript compr;
        if (CompressScript(script, compr)) {
            s << Span{compr};
            return;
        }
        unsigned int nSize = script.size() + nSpecialScripts;
        s << VARINT(nSize);
        s << Span{script};
    }